

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O1

int duckdb_shell_sqlite3_complete(char *zSql)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint unaff_EBX;
  int iVar7;
  int unaff_R13D;
  bool bVar8;
  
  iVar7 = 2;
LAB_0022ba6f:
  bVar1 = *zSql;
  if (bVar1 < 0x20) {
    if ((bVar1 - 9 < 2) || (bVar1 - 0xc < 2)) {
switchD_0022ba91_caseD_20:
      unaff_R13D = 1;
      goto LAB_0022bbd6;
    }
    if (bVar1 == 0) {
      return (uint)(iVar7 == 0);
    }
switchD_0022ba91_caseD_21:
    unaff_R13D = 2;
LAB_0022bbd6:
    if (unaff_R13D != 1) {
      iVar7 = unaff_R13D;
    }
    uVar4 = 1;
    uVar3 = unaff_EBX;
  }
  else {
    if (0x2c < bVar1) {
      if (bVar1 == 0x2d) {
        if (((byte *)zSql)[1] == 0x2d) {
          for (; *zSql != 0; zSql = (char *)((byte *)zSql + 1)) {
            if (*zSql == 10) goto switchD_0022ba91_caseD_20;
          }
          unaff_EBX = (uint)(iVar7 == 0);
LAB_0022bbf4:
          uVar4 = 0;
          uVar3 = unaff_EBX;
          goto LAB_0022bbe0;
        }
      }
      else if (bVar1 == 0x2f) {
        if (((byte *)zSql)[1] == 0x2a) {
          zSql = (char *)((byte *)zSql + 3);
          do {
            if (((byte *)zSql)[-1] == 0x2a) {
              if (*zSql == 0x2f) goto switchD_0022ba91_caseD_20;
            }
            else if (((byte *)zSql)[-1] == 0) goto LAB_0022bc00;
            zSql = (char *)((byte *)zSql + 1);
          } while( true );
        }
      }
      else if (bVar1 == 0x3b) {
        unaff_R13D = 0;
        goto LAB_0022bbd6;
      }
      goto switchD_0022ba91_caseD_21;
    }
    switch(bVar1) {
    case 0x20:
      goto switchD_0022ba91_caseD_20;
    default:
      goto switchD_0022ba91_caseD_21;
    case 0x22:
    case 0x27:
      do {
        bVar2 = ((byte *)zSql)[1];
        zSql = (char *)((byte *)zSql + 1);
        if (bVar2 == 0) break;
      } while (bVar2 != bVar1);
      uVar4 = 0;
      uVar3 = uVar4;
      if (bVar2 != 0) {
        unaff_R13D = 1;
        goto LAB_0022bbd6;
      }
      break;
    case 0x24:
      uVar5 = 1;
LAB_0022bafe:
      bVar1 = ((byte *)zSql)[uVar5];
      uVar6 = (ulong)bVar1;
      if ((bVar1 == 0) || (uVar6 = uVar5, bVar1 == 0x24)) goto LAB_0022bba0;
      if (((byte)(bVar1 + 0xbf) < 0x1a) || ((char)bVar1 < '\0' || (byte)(bVar1 + 0x9f) < 0x1a)) {
LAB_0022bb4a:
        uVar5 = uVar5 + 1;
        goto LAB_0022bafe;
      }
      if (1 < uVar5) {
        uVar6 = 0;
        if (9 < (byte)(bVar1 - 0x30)) goto LAB_0022bba0;
        goto LAB_0022bb4a;
      }
      uVar6 = 0;
LAB_0022bba0:
      if (uVar6 == 0) {
        unaff_R13D = 2;
        bVar8 = true;
        uVar3 = unaff_EBX;
      }
      else {
        zSql = skipDollarQuotedString
                         ((char *)((byte *)zSql + uVar6 + 1),(char *)((byte *)zSql + 1),uVar6 - 1);
        bVar8 = (byte *)zSql != (byte *)0x0;
        uVar3 = 0;
        if (bVar8) {
          unaff_R13D = 1;
          uVar3 = unaff_EBX;
        }
      }
      unaff_EBX = uVar3;
      if (!bVar8) goto LAB_0022bbf4;
      goto LAB_0022bbd6;
    }
  }
  goto LAB_0022bbe0;
LAB_0022bc00:
  zSql = (char *)((byte *)zSql + -1);
  uVar4 = 0;
  uVar3 = 0;
LAB_0022bbe0:
  unaff_EBX = uVar3;
  zSql = (char *)((byte *)zSql + 1);
  if ((char)uVar4 == '\0') {
    return unaff_EBX;
  }
  goto LAB_0022ba6f;
}

Assistant:

int sqlite3_complete(const char *zSql) {
	auto state = SQLParseState::NORMAL;

	for (; *zSql; zSql++) {
		SQLParseState next_state;
		switch (*zSql) {
		case ';':
			next_state = SQLParseState::SEMICOLON;
			break;
		case ' ':
		case '\r':
		case '\t':
		case '\n':
		case '\f': { /* White space is ignored */
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '/': { /* C-style comments */
			if (zSql[1] != '*') {
				next_state = SQLParseState::NORMAL;
				break;
			}
			zSql += 2;
			while (zSql[0] && (zSql[0] != '*' || zSql[1] != '/')) {
				zSql++;
			}
			if (zSql[0] == 0) {
				// unterminated c-style string
				return 0;
			}
			zSql++;
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '-': { /* SQL-style comments from "--" to end of line */
			if (zSql[1] != '-') {
				next_state = SQLParseState::NORMAL;
				break;
			}
			while (*zSql && *zSql != '\n') {
				zSql++;
			}
			if (*zSql == 0) {
				// unterminated SQL-style comment - return whether or not we had a semicolon right before it
				return state == SQLParseState::SEMICOLON ? 1 : 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '$': { /* Dollar-quoted strings */
			// check if this is a dollar-quoted string
			idx_t next_dollar = 0;
			for (idx_t idx = 1; zSql[idx]; idx++) {
				if (zSql[idx] == '$') {
					// found the next dollar
					next_dollar = idx;
					break;
				}
				// all characters can be between A-Z, a-z or \200 - \377
				if (zSql[idx] >= 'A' && zSql[idx] <= 'Z') {
					continue;
				}
				if (zSql[idx] >= 'a' && zSql[idx] <= 'z') {
					continue;
				}
				if (zSql[idx] >= '\200' && zSql[idx] <= '\377') {
					continue;
				}
				// the first character CANNOT be a numeric, only subsequent characters
				if (idx > 1 && zSql[idx] >= '0' && zSql[idx] <= '9') {
					continue;
				}
				// not a dollar quoted string
				break;
			}
			if (next_dollar == 0) {
				// not a dollar quoted string
				next_state = SQLParseState::NORMAL;
				break;
			}
			auto start = zSql + 1;
			zSql += next_dollar;
			const char *delimiterStart = start;
			idx_t delimiterLength = zSql - start;
			zSql++;
			// skip the dollar quoted string
			zSql = skipDollarQuotedString(zSql, delimiterStart, delimiterLength);
			if (!zSql) {
				// unterminated dollar string
				return 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
			//		case '`': /* Grave-accent quoted symbols used by MySQL */
		case '"': /* single- and double-quoted strings */
		case '\'': {
			int c = *zSql;
			zSql++;
			while (*zSql && *zSql != c) {
				zSql++;
			}
			if (*zSql == 0) {
				// unterminated single or double quoted string
				return 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		default:
			next_state = SQLParseState::NORMAL;
		}
		// white space is ignored (no change in state)
		if (next_state != SQLParseState::WHITESPACE) {
			state = next_state;
		}
	}
	return state == SQLParseState::SEMICOLON ? 1 : 0;
}